

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyz::VariablesQbSetSpeed(ChNodeFEAxyz *this,double step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChVector<double> local_78;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_60;
  ChVectorRef *local_48;
  undefined8 local_40;
  long local_30;
  ChVectorRef local_28;
  
  dVar1 = *(double *)&this->field_0x38;
  dVar2 = *(double *)&this->field_0x40;
  dVar3 = *(double *)&this->field_0x48;
  ChVariables::Get_qb(&local_28,&(this->variables).super_ChVariables);
  local_60._0_8_ =
       local_28.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  local_60._8_8_ = 3;
  local_40 = 0;
  local_30 = local_28.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  local_48 = &local_28;
  if (2 < (long)local_28.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_78,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_60,(type *)0x0);
    if ((ChVector<double> *)&this->field_0x38 != &local_78) {
      *(double *)&this->field_0x38 = local_78.m_data[0];
      *(double *)&this->field_0x40 = local_78.m_data[1];
      *(double *)&this->field_0x48 = local_78.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      dVar4 = 1.0 / step;
      *(double *)&this->field_0x50 = dVar4 * (*(double *)&this->field_0x38 - dVar1);
      *(double *)&this->field_0x58 = dVar4 * (*(double *)&this->field_0x40 - dVar2);
      *(double *)&this->field_0x60 = dVar4 * (*(double *)&this->field_0x48 - dVar3);
    }
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void VariablesQbSetSpeed(double step = 0) override {
        ChVector<> old_dt = pos_dt;
        SetPos_dt(variables.Get_qb().segment(0, 3));
        if (step) {
            SetPos_dtdt((pos_dt - old_dt) / step);
        }
    }